

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O1

void save_keypress_history(keypress *kp)

{
  uint uVar1;
  keypress *__dest;
  int16_t iVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  
  if (*borg_cfg != 0) {
    if (kp->type == EVT_KBRD) {
      uVar1 = kp->code;
      uVar5 = (ulong)uVar1;
      if (uVar1 - 0x20 < 0x5f) {
        pcVar3 = format("& Key <%c> (0x%02lX)",uVar5,uVar5);
      }
      else {
        if (uVar5 == 0xe000) {
          pcVar3 = "& Key <Esc> (0x%02lX)";
          uVar5 = 0xe000;
        }
        else if (uVar1 == 0x9c) {
          pcVar3 = "& Key <Enter> (0x%02lX)";
          uVar5 = 0x9c;
        }
        else {
          pcVar3 = "& Key <0x%02lX>";
        }
        pcVar3 = format(pcVar3,uVar5);
      }
    }
    else {
      pcVar3 = format("& non-Keyboard <0x%02X>");
    }
    borg_note_internal(false,pcVar3);
  }
  iVar2 = borg_key_history_head;
  __dest = borg_key_history;
  lVar4 = (long)borg_key_history_head;
  borg_key_history[lVar4].code = kp->code;
  borg_key_history_head = borg_key_history_head + 1;
  __dest[lVar4].type = kp->type;
  if (iVar2 == 0x1fff) {
    memcpy(__dest,__dest + 0x1f9b,0x4b0);
    borg_key_history_head = 100;
  }
  return;
}

Assistant:

void save_keypress_history(struct keypress *kp)
{
    /* Note the keypress */
    if (borg_cfg[BORG_VERBOSE]) {
        if (kp->type == EVT_KBRD) {
            keycode_t k = kp->code;
            if (k >= 32 && k <= 126) {
                borg_note(format("& Key <%c> (0x%02lX)", (char)k, (unsigned long)k));
            } else {
                if (k == KC_ENTER)
                    borg_note(format("& Key <Enter> (0x%02lX)", (unsigned long)k));
                else if (k == ESCAPE)
                    borg_note(format("& Key <Esc> (0x%02lX)", (unsigned long)k));
                else
                    borg_note(format("& Key <0x%02lX>", (unsigned long)k));
            }
        } else {
            borg_note(format("& non-Keyboard <0x%02X>", kp->type));
        }

    }

    /* Store the char, advance the queue */
    borg_key_history[borg_key_history_head].code = kp->code;
    borg_key_history[borg_key_history_head++].type = kp->type;

    /* on full array, keep the last 100 */
    if (borg_key_history_head == KEY_SIZE) {
        memcpy(borg_key_history, &borg_key_history[KEY_SIZE - 101], sizeof(struct keypress) * 100);
        borg_key_history_head = 100;
    }
}